

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O1

WebAssemblyTable *
Js::WebAssemblyTable::Create(uint32 initial,uint32 maximum,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  Recycler *pRVar5;
  Type *values;
  WebAssemblyTable *this;
  size_t size;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (maximum < initial) {
LAB_00da27ba:
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ebf6,(PCWSTR)0x0);
  }
  uVar3 = 0xffffffff;
  if (DAT_015aa2e2 == '\0') {
    uVar3 = DAT_015aa2e8;
  }
  if ((uVar3 < initial) || (uVar3 < maximum)) goto LAB_00da27ba;
  if (initial == 0) {
    values = (Type *)0x0;
  }
  else {
    local_60 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_9783269;
    data.filename._0_4_ = 0xd1;
    data.plusSize = (ulong)initial;
    pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      data._32_8_ = __tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)data._32_8_ = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00da27c9;
      *(undefined4 *)data._32_8_ = 0;
    }
    size = (ulong)initial << 3;
    values = (Type *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                               (pRVar5,size);
    if (values == (Type *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      data._32_8_ = __tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)data._32_8_ = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00da27c9:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)data._32_8_ = 0;
    }
    memset(values,0,size);
  }
  local_60 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9783269;
  data.filename._0_4_ = 0xd3;
  pRVar5 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  this = (WebAssemblyTable *)new<Memory::Recycler>(0x38,pRVar5,0x38bbb2);
  WebAssemblyTable(this,values,initial,initial,maximum,
                   (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   webAssemblyTableType).ptr);
  return this;
}

Assistant:

WebAssemblyTable *
WebAssemblyTable::Create(uint32 initial, uint32 maximum, ScriptContext * scriptContext)
{
    if (initial > maximum || initial > Wasm::Limits::GetMaxTableSize() || maximum > Wasm::Limits::GetMaxTableSize())
    {
        JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
    }
    Field(Var) * values = nullptr;
    if (initial > 0)
    {
        values = RecyclerNewArrayZ(scriptContext->GetRecycler(), Field(Var), initial);
    }
    return RecyclerNew(scriptContext->GetRecycler(), WebAssemblyTable, values, initial, initial, maximum, scriptContext->GetLibrary()->GetWebAssemblyTableType());
}